

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNMachine<unsigned_char>::CATNMachine
          (CATNMachine<unsigned_char> *this,ATNMachine<unsigned_char> *atn)

{
  int iVar1;
  allocator<int> local_35;
  value_type local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> node_map;
  ATNMachine<unsigned_char> *atn_local;
  CATNMachine<unsigned_char> *this_local;
  
  this->_vptr_CATNMachine = (_func_int **)&PTR__CATNMachine_002900d8;
  node_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)atn;
  std::
  vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>::
  vector(&this->m_nodes);
  iVar1 = ATNMachine<unsigned_char>::get_node_num
                    ((ATNMachine<unsigned_char> *)
                     node_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  local_34 = -1;
  std::allocator<int>::allocator(&local_35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar1,&local_34,&local_35);
  std::allocator<int>::~allocator(&local_35);
  import_atn_node(this,(ATNMachine<unsigned_char> *)
                       node_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0,-1,
                  (vector<int,_std::allocator<int>_> *)local_30,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

CATNMachine(const ATNMachine<TCHAR>& atn)
    {
        std::vector<int> node_map(atn.get_node_num(), -1);

        import_atn_node(atn, 0, -1, node_map, 0);
    }